

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVE.cpp
# Opt level: O2

void __thiscall OpenMD::NVE::moveB(NVE *this)

{
  Molecule *pMVar1;
  StuntDouble *this_00;
  pointer ppSVar2;
  MoleculeIterator i;
  Vector3d ji;
  Vector3d Tb;
  Vector3d frc;
  Vector3d vel;
  MoleculeIterator local_c8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector3d local_60;
  Vector<double,_3U> local_48;
  
  local_c8._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_c0);
  pMVar1 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_c8);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001a6c39;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_48,this_00);
      Vector<double,_3U>::operator=(&local_78,&local_48);
      StuntDouble::getFrc((Vector3d *)&local_48,this_00);
      Vector<double,_3U>::operator=(&local_90,&local_48);
      operator*(&local_48,
                ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 / this_00->mass_) *
                0.0004184,&local_90);
      Vector<double,_3U>::add(&local_78,&local_48);
      StuntDouble::setVel(this_00,(Vector3d *)&local_78);
      if (this_00->objType_ - otDAtom < 2) {
        StuntDouble::getTrq(&local_60,this_00);
        StuntDouble::lab2Body((Vector3d *)&local_48,this_00,&local_60);
        Vector<double,_3U>::operator=(&local_a8,&local_48);
        StuntDouble::getJ((Vector3d *)&local_48,this_00);
        Vector<double,_3U>::operator=(&local_c0,&local_48);
        operator*(&local_48,(this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184,
                  &local_a8);
        Vector<double,_3U>::add(&local_c0,&local_48);
        StuntDouble::setJ(this_00,(Vector3d *)&local_c0);
      }
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001a6c39:
        this_00 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_c8);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  return;
}

Assistant:

void NVE::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          sd->setJ(ji);
        }
      }
    }

    flucQ_->moveB();
    rattle_->constraintB();
  }